

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O1

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
vkt::createShaderLibraryGroup
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,string *name,string *description,
          string *filename)

{
  pointer pcVar1;
  TestCaseGroup *this;
  
  this = (TestCaseGroup *)operator_new(0x90);
  tcu::TestCaseGroup::TestCaseGroup
            (this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__ShaderLibraryGroup_00d1b100;
  this[1].super_TestNode._vptr_TestNode = (_func_int **)&this[1].super_TestNode.m_name;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 1),pcVar1,pcVar1 + filename->_M_string_length);
  (__return_storage_ptr__->
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data.ptr = this;
  return __return_storage_ptr__;
}

Assistant:

MovePtr<tcu::TestCaseGroup> createShaderLibraryGroup (tcu::TestContext& testCtx, const string& name, const string& description, const string& filename)
{
	return MovePtr<tcu::TestCaseGroup>(new ShaderLibraryGroup(testCtx, name, description, filename));
}